

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar11;
  uint16_t uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  byte bVar17;
  uint uVar18;
  byte bVar19;
  byte *pbVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  Number NVar26;
  
  pcVar3 = is->src_;
  pCVar4 = is->dst_;
  pCVar5 = is->head_;
  cVar2 = *pcVar3;
  pbVar20 = (byte *)(pcVar3 + (cVar2 == '-'));
  bVar17 = pcVar3[cVar2 == '-'];
  if (bVar17 == 0x30) {
    pbVar20 = pbVar20 + 1;
    uVar15 = 0;
    bVar8 = false;
    iVar9 = 0;
    uVar18 = 0;
  }
  else {
    if (8 < (byte)(bVar17 - 0x31)) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      goto LAB_0065c46c;
    }
    uVar18 = bVar17 - 0x30;
    bVar17 = pbVar20[1];
    pbVar20 = pbVar20 + 1;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar17 - 0x30)) {
LAB_0065c279:
        uVar15 = 0;
        bVar8 = false;
        iVar9 = 0;
        goto LAB_0065bdf5;
      }
      iVar9 = 0;
      do {
        if ((0xccccccb < uVar18) && ('8' < (char)bVar17 || uVar18 != 0xccccccc)) goto LAB_0065bdeb;
        uVar18 = ((uint)bVar17 + uVar18 * 10) - 0x30;
        iVar9 = iVar9 + 1;
        bVar17 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar17 - 0x30)) goto LAB_0065c279;
      iVar9 = 0;
      do {
        if ((0x19999998 < uVar18) && ('5' < (char)bVar17 || uVar18 != 0x19999999))
        goto LAB_0065bdeb;
        uVar18 = ((uint)bVar17 + uVar18 * 10) - 0x30;
        iVar9 = iVar9 + 1;
        bVar17 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    bVar8 = false;
    uVar15 = 0;
  }
  goto LAB_0065bdf5;
LAB_0065bed4:
  auVar22._8_4_ = (int)(uVar10 >> 0x20);
  auVar22._0_8_ = uVar10;
  auVar22._12_4_ = 0x45300000;
  dVar25 = (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  bVar6 = true;
  goto LAB_0065bf0c;
LAB_0065bdeb:
  bVar8 = true;
  uVar15 = uVar18;
LAB_0065bdf5:
  uVar10 = (ulong)uVar15;
  dVar25 = 0.0;
  if (bVar8) {
    bVar17 = *pbVar20;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar17 - 0x30)) goto LAB_0065befa;
      do {
        if ((0xccccccccccccccb < uVar10) && (uVar10 != 0xccccccccccccccc || '8' < (char)bVar17))
        goto LAB_0065bed4;
        uVar10 = (ulong)(bVar17 & 0xf) + uVar10 * 10;
        iVar9 = iVar9 + 1;
        bVar17 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar17 - 0x30)) goto LAB_0065befa;
      do {
        if ((0x1999999999999998 < uVar10) && (uVar10 != 0x1999999999999999 || '5' < (char)bVar17))
        goto LAB_0065bed4;
        uVar10 = (ulong)(bVar17 & 0xf) + uVar10 * 10;
        iVar9 = iVar9 + 1;
        bVar17 = pbVar20[1];
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    bVar6 = false;
  }
  else {
LAB_0065befa:
    bVar6 = false;
  }
LAB_0065bf0c:
  if (bVar6) {
    bVar17 = *pbVar20;
    while ((byte)(bVar17 - 0x30) < 10) {
      if (1.7976931348623158e+307 <= dVar25) {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        goto LAB_0065c46c;
      }
      dVar25 = dVar25 * 10.0 + (double)((char)*pbVar20 + -0x30);
      bVar17 = pbVar20[1];
      pbVar20 = pbVar20 + 1;
    }
  }
  bVar17 = *pbVar20;
  pbVar20 = pbVar20 + (bVar17 == 0x2e);
  iVar16 = 0;
  uVar13 = uVar10;
  if (bVar17 == 0x2e) {
    if ((byte)(*pbVar20 - 0x3a) < 0xf6) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      goto LAB_0065c46c;
    }
    iVar16 = 0;
    if (!bVar6) {
      uVar13 = (ulong)uVar18;
      if (bVar8) {
        uVar13 = uVar10;
      }
      bVar17 = *pbVar20;
      iVar16 = 0;
      if ((0xf5 < (byte)(bVar17 - 0x3a)) && (iVar16 = 0, uVar13 < 0x20000000000000)) {
        lVar14 = 0;
        do {
          uVar13 = (ulong)(bVar17 & 0xf) + uVar13 * 10;
          iVar9 = (uint)(uVar13 != 0) + iVar9;
          bVar17 = pbVar20[lVar14 + 1];
          lVar14 = lVar14 + 1;
          if ((byte)(bVar17 - 0x3a) < 0xf6) break;
        } while (uVar13 < 0x20000000000000);
        iVar16 = -(int)lVar14;
        pbVar20 = pbVar20 + lVar14;
      }
      auVar23._8_4_ = (int)(uVar13 >> 0x20);
      auVar23._0_8_ = uVar13;
      auVar23._12_4_ = 0x45300000;
      dVar25 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar17 = *pbVar20;
    while ((byte)(bVar17 - 0x30) < 10) {
      if (iVar9 < 0x11) {
        dVar25 = dVar25 * 10.0 + (double)(int)(bVar17 - 0x30);
        iVar16 = iVar16 + -1;
        if (0.0 < dVar25) {
          iVar9 = iVar9 + 1;
        }
      }
      pbVar1 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
      bVar17 = *pbVar1;
    }
  }
  bVar17 = *pbVar20;
  pbVar20 = pbVar20 + (bVar17 == 0x65);
  if (bVar17 == 0x65) {
LAB_0065c0b5:
    uVar10 = (ulong)uVar18;
    if (bVar8) {
      uVar10 = uVar13;
    }
    if (!bVar6) {
      auVar24._8_4_ = (int)(uVar10 >> 0x20);
      auVar24._0_8_ = uVar10;
      auVar24._12_4_ = 0x45300000;
      dVar25 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar17 = *pbVar20;
    pbVar20 = pbVar20 + (bVar17 == 0x2b);
    if (bVar17 == 0x2b) {
      bVar21 = false;
    }
    else {
      bVar21 = *pbVar20 == 0x2d;
      pbVar20 = pbVar20 + bVar21;
    }
    bVar17 = *pbVar20;
    if ((byte)(bVar17 - 0x30) < 10) {
      pbVar20 = pbVar20 + 1;
      iVar9 = bVar17 - 0x30;
      if (bVar21) {
        bVar17 = *pbVar20;
        while ((byte)(bVar17 - 0x30) < 10) {
          iVar9 = (uint)bVar17 + iVar9 * 10 + -0x30;
          if (iVar9 < 0xccccccc) {
            pbVar20 = pbVar20 + 1;
          }
          else {
            do {
              pbVar1 = pbVar20 + 1;
              pbVar20 = pbVar20 + 1;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
          bVar17 = *pbVar20;
        }
      }
      else {
        do {
          bVar17 = *pbVar20;
          bVar19 = bVar17 - 0x30;
          if (9 < bVar19) goto LAB_0065c1e8;
          pbVar20 = pbVar20 + 1;
          iVar9 = (uint)bVar17 + iVar9 * 10 + -0x30;
        } while (iVar9 <= 0x134 - iVar16);
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
LAB_0065c1e8:
        if (bVar19 < 10) {
          bVar21 = false;
          goto LAB_0065c298;
        }
      }
      iVar7 = -iVar9;
      if (!bVar21) {
        iVar7 = iVar9;
      }
      iVar9 = iVar7;
      bVar21 = true;
    }
    else {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      bVar21 = false;
      iVar9 = 0;
    }
LAB_0065c298:
    if (!bVar21) goto LAB_0065c46c;
  }
  else {
    bVar17 = *pbVar20;
    pbVar20 = pbVar20 + (bVar17 == 0x45);
    iVar9 = 0;
    if (bVar17 == 0x45) goto LAB_0065c0b5;
  }
  if (!bVar6) {
    if (bVar8) {
      if (cVar2 == '-') {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar13);
        if (!bVar8) {
          ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
        }
        goto LAB_0065c46c;
      }
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).n = (Number)0x0;
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar11->data_ = uVar13;
      uVar12 = (ushort)((uVar13 & 0xffffffff80000000) == 0) * 0x20 +
               ((ushort)(uVar13 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar13) << 7) + 0x116;
    }
    else {
      if (cVar2 == '-') {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).n = (Number)0x0;
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar11->data_ = (long)(int)-uVar18;
        uVar12 = 0xb6;
        if ((int)uVar18 < 1) {
          uVar12 = 0x1f6;
        }
        (pGVar11->data_).f.flags = uVar12;
        goto LAB_0065c46c;
      }
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).n = (Number)0x0;
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar11->data_ = (ulong)uVar18;
      uVar12 = (ushort)(-1 < (int)uVar18) << 5 | 0x1d6;
    }
    (pGVar11->data_).f.flags = uVar12;
    goto LAB_0065c46c;
  }
  uVar15 = iVar9 + iVar16;
  if ((int)uVar15 < -0x134) {
    NVar26.i64 = 0;
    if (-0x269 < (int)uVar15) {
      uVar15 = -uVar15 - 0x134;
      if (0x134 < uVar15) goto LAB_0065c493;
      dVar25 = dVar25 / 1e+308;
LAB_0065c41e:
      NVar26.d = dVar25 / *(double *)(internal::Pow10(int)::e + (ulong)uVar15 * 8);
    }
  }
  else {
    if ((int)uVar15 < 0) {
      uVar15 = -uVar15;
      if (0x134 < uVar15) goto LAB_0065c493;
      goto LAB_0065c41e;
    }
    if (0x134 < uVar15) {
LAB_0065c493:
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    NVar26.d = dVar25 * *(double *)(internal::Pow10(int)::e + (ulong)uVar15 * 8);
  }
  pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  if (cVar2 == '-') {
    NVar26.u64 = NVar26.u64 ^ 0x8000000000000000;
  }
  (pGVar11->data_).n = (Number)0x0;
  (pGVar11->data_).s.str = (Ch *)0x0;
  (pGVar11->data_).n = NVar26;
  (pGVar11->data_).f.flags = 0x216;
LAB_0065c46c:
  is->src_ = (Ch *)pbVar20;
  is->dst_ = pCVar4;
  is->head_ = pCVar5;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }